

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::TemplatedFetchCommittedRange<unsigned_char>
               (UpdateInfo *info,idx_t start,idx_t end,idx_t result_offset,Vector *result)

{
  uint uVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (info->N != 0) {
    uVar1 = info->max;
    pdVar2 = result->data;
    uVar4 = 0;
    do {
      uVar5 = (ulong)*(uint *)((long)&info[1].segment + uVar4 * 4);
      bVar3 = false;
      if ((start <= uVar5) && (bVar3 = true, uVar5 < end)) {
        pdVar2[uVar5 + (result_offset - start)] =
             *(data_t *)((long)&info[1].segment + uVar4 + (ulong)uVar1 * 4);
        bVar3 = false;
      }
    } while ((!bVar3) && (uVar4 = uVar4 + 1, uVar4 < info->N));
  }
  return;
}

Assistant:

static void MergeUpdateInfoRange(UpdateInfo &current, idx_t start, idx_t end, idx_t result_offset, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	for (idx_t i = 0; i < current.N; i++) {
		auto tuple_idx = tuples[i];
		if (tuple_idx < start) {
			continue;
		} else if (tuple_idx >= end) {
			break;
		}
		auto result_idx = result_offset + tuple_idx - start;
		result_data[result_idx] = info_data[i];
	}
}